

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_string.cpp
# Opt level: O2

void duckdb::StringDecompressFunction<unsigned_short>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  VectorType VVar1;
  idx_t count;
  ulong *puVar2;
  ushort *puVar3;
  unsigned_long *puVar4;
  long lVar5;
  string_t *psVar6;
  unsigned_short *puVar7;
  optional_idx oVar8;
  FunctionLocalState *pFVar9;
  reference vector;
  Vector *vector_00;
  idx_t iVar10;
  SelectionVector *sel;
  void *in_R9;
  data_ptr_t pdVar11;
  idx_t iVar12;
  undefined1 in_stack_ffffffffffffff78;
  optional_idx dict_size;
  data_ptr_t local_70;
  unsigned_long *local_68;
  
  dict_size.index = (idx_t)state[1]._vptr_ExpressionState;
  pFVar9 = optional_ptr<duckdb::FunctionLocalState,_true>::operator->
                     ((optional_ptr<duckdb::FunctionLocalState,_true> *)&dict_size);
  ArenaAllocator::Reset((ArenaAllocator *)(pFVar9 + 1));
  vector = vector<duckdb::Vector,_true>::get<true>(&args->data,0);
  count = args->count;
  VVar1 = vector->vector_type;
  if (VVar1 == FLAT_VECTOR) {
    Vector::SetVectorType(result,FLAT_VECTOR);
    psVar6 = (string_t *)result->data;
    puVar7 = (unsigned_short *)vector->data;
    FlatVector::VerifyFlatVector(vector);
    FlatVector::VerifyFlatVector(result);
    UnaryExecutor::
    ExecuteFlat<unsigned_short,duckdb::string_t,duckdb::UnaryLambdaWrapper,duckdb::StringDecompressFunction<unsigned_short>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(unsigned_short_const&)_1_>
              (puVar7,psVar6,count,&vector->validity,&result->validity,in_R9,
               (bool)in_stack_ffffffffffffff78);
  }
  else {
    if (VVar1 == DICTIONARY_VECTOR) {
      dict_size = DictionaryVector::DictionarySize(vector);
      if (((dict_size.index != 0xffffffffffffffff) &&
          (iVar12 = optional_idx::GetIndex(&dict_size), iVar12 * 2 <= count)) &&
         (vector_00 = DictionaryVector::Child(vector), vector_00->vector_type == FLAT_VECTOR)) {
        psVar6 = (string_t *)result->data;
        puVar7 = (unsigned_short *)vector_00->data;
        iVar12 = optional_idx::GetIndex(&dict_size);
        FlatVector::VerifyFlatVector(vector_00);
        FlatVector::VerifyFlatVector(result);
        UnaryExecutor::
        ExecuteFlat<unsigned_short,duckdb::string_t,duckdb::UnaryLambdaWrapper,duckdb::StringDecompressFunction<unsigned_short>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(unsigned_short_const&)_1_>
                  (puVar7,psVar6,iVar12,&vector_00->validity,&result->validity,in_R9,
                   (bool)in_stack_ffffffffffffff78);
        sel = DictionaryVector::SelVector(vector);
        iVar12 = optional_idx::GetIndex(&dict_size);
        Vector::Dictionary(result,result,iVar12,sel,count);
        return;
      }
    }
    else if (VVar1 == CONSTANT_VECTOR) {
      Vector::SetVectorType(result,CONSTANT_VECTOR);
      puVar2 = (ulong *)result->data;
      puVar3 = (ushort *)vector->data;
      puVar4 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar4 != (unsigned_long *)0x0) && ((*puVar4 & 1) == 0)) {
        ConstantVector::SetNull(result,true);
        return;
      }
      ConstantVector::SetNull(result,false);
      *puVar2 = (ulong)(byte)*puVar3 | (ulong)(*puVar3 >> 8) << 0x20;
      puVar2[1] = 0;
      return;
    }
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&dict_size);
    Vector::ToUnifiedFormat(vector,count,(UnifiedVectorFormat *)&dict_size);
    Vector::SetVectorType(result,FLAT_VECTOR);
    oVar8 = dict_size;
    pdVar11 = result->data;
    FlatVector::VerifyFlatVector(result);
    if (local_68 == (unsigned_long *)0x0) {
      pdVar11 = pdVar11 + 8;
      for (iVar12 = 0; count != iVar12; iVar12 = iVar12 + 1) {
        lVar5 = *(long *)oVar8.index;
        iVar10 = iVar12;
        if (lVar5 != 0) {
          iVar10 = (idx_t)*(uint *)(lVar5 + iVar12 * 4);
        }
        *(ulong *)(pdVar11 + -8) =
             (ulong)(byte)*(ushort *)(local_70 + iVar10 * 2) |
             (ulong)(*(ushort *)(local_70 + iVar10 * 2) >> 8) << 0x20;
        pdVar11[0] = '\0';
        pdVar11[1] = '\0';
        pdVar11[2] = '\0';
        pdVar11[3] = '\0';
        pdVar11[4] = '\0';
        pdVar11[5] = '\0';
        pdVar11[6] = '\0';
        pdVar11[7] = '\0';
        pdVar11 = pdVar11 + 0x10;
      }
    }
    else {
      pdVar11 = pdVar11 + 8;
      for (iVar12 = 0; count != iVar12; iVar12 = iVar12 + 1) {
        lVar5 = *(long *)oVar8.index;
        iVar10 = iVar12;
        if (lVar5 != 0) {
          iVar10 = (idx_t)*(uint *)(lVar5 + iVar12 * 4);
        }
        if ((local_68[iVar10 >> 6] >> (iVar10 & 0x3f) & 1) == 0) {
          TemplatedValidityMask<unsigned_long>::SetInvalid
                    (&(result->validity).super_TemplatedValidityMask<unsigned_long>,iVar12);
        }
        else {
          *(ulong *)(pdVar11 + -8) =
               (ulong)(byte)*(ushort *)(local_70 + iVar10 * 2) |
               (ulong)(*(ushort *)(local_70 + iVar10 * 2) >> 8) << 0x20;
          pdVar11[0] = '\0';
          pdVar11[1] = '\0';
          pdVar11[2] = '\0';
          pdVar11[3] = '\0';
          pdVar11[4] = '\0';
          pdVar11[5] = '\0';
          pdVar11[6] = '\0';
          pdVar11[7] = '\0';
        }
        pdVar11 = pdVar11 + 0x10;
      }
    }
    UnifiedVectorFormat::~UnifiedVectorFormat((UnifiedVectorFormat *)&dict_size);
  }
  return;
}

Assistant:

static void StringDecompressFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	auto &allocator = ExecuteFunctionState::GetFunctionState(state)->Cast<StringDecompressLocalState>().allocator;
	allocator.Reset();
	UnaryExecutor::Execute<INPUT_TYPE, string_t>(
	    args.data[0], result, args.size(),
	    [&](const INPUT_TYPE &input) { return StringDecompress<INPUT_TYPE>(input, allocator); },
	    FunctionErrors::CANNOT_ERROR);
}